

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::set_max_connections(torrent *this,int limit,bool state_update)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int num;
  error_code local_28;
  
  uVar3 = 0xffffff;
  if (0 < limit) {
    uVar3 = limit;
  }
  uVar4 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if (((uint)(uVar4 >> 0x21) & 0xffffff) != uVar3) {
    if (state_update) {
      state_updated(this);
      uVar4 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    }
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         uVar4 & 0xfe000001ffffffff | (ulong)(uVar3 & 0xffffff) << 0x21;
    update_want_peers(this);
    iVar2 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if (((byte)iVar2 & state_update) == 1) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** set-max-connections: %d",
                 (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                               >> 0x21) & 0xffffff));
    }
    iVar2 = (int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                .
                                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_torrent_hot_members).m_connections.
                               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                               .
                               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) -
            (int)((ulong)((long)(this->m_peers_to_disconnect).
                                super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_peers_to_disconnect).
                               super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
    uVar3 = (uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21) &
            0xffffff;
    num = iVar2 - uVar3;
    if (num != 0 && (int)uVar3 <= iVar2) {
      local_28 = errors::make_error_code(too_many_connections);
      disconnect_peers(this,num,&local_28);
    }
    if ((state_update) && (bVar1 = (this->m_need_save_resume_data).m_val, (bVar1 & 0x20) == 0)) {
      (this->m_need_save_resume_data).m_val = bVar1 | 0x20;
      state_updated(this);
    }
  }
  return;
}

Assistant:

void torrent::set_max_connections(int limit, bool const state_update)
	{
		TORRENT_ASSERT(is_single_thread());
		// TODO: perhaps 0 should actually mean 0
		if (limit <= 0) limit = (1 << 24) - 1;
		if (int(m_max_connections) == limit) return;
		if (state_update) state_updated();
		m_max_connections = aux::numeric_cast<std::uint32_t>(limit);
		update_want_peers();

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log() && state_update)
			debug_log("*** set-max-connections: %d", m_max_connections);
#endif

		if (num_peers() > int(m_max_connections))
		{
			disconnect_peers(num_peers() - m_max_connections
				, errors::too_many_connections);
		}

		if (state_update)
			set_need_save_resume(torrent_handle::if_config_changed);
	}